

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

uint deflate_compute_precode_items(u8 *lens,uint num_lens,u32 *precode_freqs,uint *precode_items)

{
  byte bVar1;
  uint *in_RCX;
  void *in_RDX;
  uint *puVar2;
  uint in_ESI;
  long in_RDI;
  bool bVar3;
  u8 len;
  uint extra_bits;
  uint run_end;
  uint run_start;
  uint *itemptr;
  int local_44;
  int local_40;
  int local_3c;
  uint local_30;
  uint local_2c;
  uint *local_28;
  
  memset(in_RDX,0,0x4c);
  local_2c = 0;
  local_28 = in_RCX;
  do {
    bVar1 = *(byte *)(in_RDI + (ulong)local_2c);
    local_30 = local_2c;
    do {
      local_30 = local_30 + 1;
      bVar3 = false;
      if (local_30 != in_ESI) {
        bVar3 = bVar1 == *(byte *)(in_RDI + (ulong)local_30);
      }
    } while (bVar3);
    if (bVar1 == 0) {
      for (; 10 < local_30 - local_2c; local_2c = local_3c + 0xb + local_2c) {
        if ((local_30 - local_2c) - 0xb < 0x80) {
          local_3c = (local_30 - local_2c) + -0xb;
        }
        else {
          local_3c = 0x7f;
        }
        *(int *)((long)in_RDX + 0x48) = *(int *)((long)in_RDX + 0x48) + 1;
        *local_28 = local_3c << 5 | 0x12;
        local_28 = local_28 + 1;
      }
      if (2 < local_30 - local_2c) {
        if ((local_30 - local_2c) - 3 < 8) {
          local_40 = (local_30 - local_2c) + -3;
        }
        else {
          local_40 = 7;
        }
        *(int *)((long)in_RDX + 0x44) = *(int *)((long)in_RDX + 0x44) + 1;
        *local_28 = local_40 << 5 | 0x11;
        local_2c = local_40 + 3 + local_2c;
        local_28 = local_28 + 1;
      }
    }
    else if (3 < local_30 - local_2c) {
      *(int *)((long)in_RDX + (ulong)bVar1 * 4) = *(int *)((long)in_RDX + (ulong)bVar1 * 4) + 1;
      *local_28 = (uint)bVar1;
      local_2c = local_2c + 1;
      local_28 = local_28 + 1;
      do {
        if ((local_30 - local_2c) - 3 < 4) {
          local_44 = (local_30 - local_2c) + -3;
        }
        else {
          local_44 = 3;
        }
        *(int *)((long)in_RDX + 0x40) = *(int *)((long)in_RDX + 0x40) + 1;
        puVar2 = local_28 + 1;
        *local_28 = local_44 << 5 | 0x10;
        local_2c = local_44 + 3 + local_2c;
        local_28 = puVar2;
      } while (2 < local_30 - local_2c);
    }
    for (; local_2c != local_30; local_2c = local_2c + 1) {
      *(int *)((long)in_RDX + (ulong)bVar1 * 4) = *(int *)((long)in_RDX + (ulong)bVar1 * 4) + 1;
      *local_28 = (uint)bVar1;
      local_28 = local_28 + 1;
    }
  } while (local_2c != in_ESI);
  return (uint)((long)local_28 - (long)in_RCX >> 2);
}

Assistant:

static unsigned
deflate_compute_precode_items(const u8 lens[], const unsigned num_lens,
			      u32 precode_freqs[], unsigned precode_items[])
{
	unsigned *itemptr;
	unsigned run_start;
	unsigned run_end;
	unsigned extra_bits;
	u8 len;

	memset(precode_freqs, 0,
	       DEFLATE_NUM_PRECODE_SYMS * sizeof(precode_freqs[0]));

	itemptr = precode_items;
	run_start = 0;
	do {
		/* Find the next run of codeword lengths. */

		/* len = the length being repeated */
		len = lens[run_start];

		/* Extend the run. */
		run_end = run_start;
		do {
			run_end++;
		} while (run_end != num_lens && len == lens[run_end]);

		if (len == 0) {
			/* Run of zeroes. */

			/* Symbol 18: RLE 11 to 138 zeroes at a time. */
			while ((run_end - run_start) >= 11) {
				extra_bits = MIN((run_end - run_start) - 11,
						 0x7F);
				precode_freqs[18]++;
				*itemptr++ = 18 | (extra_bits << 5);
				run_start += 11 + extra_bits;
			}

			/* Symbol 17: RLE 3 to 10 zeroes at a time. */
			if ((run_end - run_start) >= 3) {
				extra_bits = MIN((run_end - run_start) - 3,
						 0x7);
				precode_freqs[17]++;
				*itemptr++ = 17 | (extra_bits << 5);
				run_start += 3 + extra_bits;
			}
		} else {

			/* A run of nonzero lengths. */

			/* Symbol 16: RLE 3 to 6 of the previous length. */
			if ((run_end - run_start) >= 4) {
				precode_freqs[len]++;
				*itemptr++ = len;
				run_start++;
				do {
					extra_bits = MIN((run_end - run_start) -
							 3, 0x3);
					precode_freqs[16]++;
					*itemptr++ = 16 | (extra_bits << 5);
					run_start += 3 + extra_bits;
				} while ((run_end - run_start) >= 3);
			}
		}

		/* Output any remaining lengths without RLE. */
		while (run_start != run_end) {
			precode_freqs[len]++;
			*itemptr++ = len;
			run_start++;
		}
	} while (run_start != num_lens);

	return itemptr - precode_items;
}